

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O3

libcaption_stauts_t caption_frame_delete_to_end_of_row(caption_frame_t *frame)

{
  int col;
  
  if ((frame->write != (caption_frame_buffer_t *)0x0) && (col = (int)(frame->state).col, col < 0x20)
     ) {
    do {
      caption_frame_write_char(frame,(int)(frame->state).row,col,eia608_style_white,0,"");
      col = col + 1;
    } while (col != 0x20);
  }
  return LIBCAPTION_READY;
}

Assistant:

libcaption_stauts_t caption_frame_delete_to_end_of_row(caption_frame_t* frame)
{
    int c;
    if (frame->write) {
        for (c = frame->state.col; c < SCREEN_COLS; ++c) {
            caption_frame_write_char(frame, frame->state.row, c, eia608_style_white, 0, EIA608_CHAR_NULL);
        }
    }

    // TODO test this and replace loop
    //  uint8_t* dst = (uint8_t*)frame_buffer_cell(frame->write, frame->state.row, frame->state.col);
    //  memset(dst,0,sizeof(caption_frame_cell_t) * (SCREEN_COLS - frame->state.col - 1))

    return LIBCAPTION_READY;
}